

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case2352(ParserTester *this)

{
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "\n                   switch ( x ) {\n                       case 1 : y ;\n                       case 2 : z ( ) ;\n                   }\n                   "
             ,&local_31);
  Expectation::Expectation(&local_100);
  parseStatement(this,&local_30,&local_100);
  Expectation::~Expectation(&local_100);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case2352()
{
    parseStatement(R"(
                   switch ( x ) {
                       case 1 : y ;
                       case 2 : z ( ) ;
                   }
                   )");
}